

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  ~IfcSpace((IfcSpace *)
            (&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.
                                super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}